

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_set_flag(MppBufSlots slots,RK_S32 index,SlotUsageType type)

{
  undefined1 local_38 [8];
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  SlotUsageType type_local;
  RK_S32 index_local;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_set_flag");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_38,*slots,1);
    if ((index < 0) || (auto_lock.mLock[2].mMutex.__data.__kind <= index)) {
      _dump_slots("mpp_buf_slot_set_flag",(MppBufSlotsImpl *)auto_lock.mLock);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_set_flag",0x415);
      abort();
    }
    slot_ops_with_log((MppBufSlotsImpl *)auto_lock.mLock,
                      (MppBufSlotEntry *)
                      ((long)auto_lock.mLock[5].mMutex.__data.__list.__next + (long)index * 0x38),
                      set_flag_op[type],(void *)0x0);
    slots_local._4_4_ = MPP_OK;
    Mutex::Autolock::~Autolock((Autolock *)local_38);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_set_flag(MppBufSlots slots, RK_S32 index, SlotUsageType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    slot_ops_with_log(impl, &impl->slots[index], set_flag_op[type], NULL);
    return MPP_OK;
}